

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O2

void __thiscall
QGraphicsGridLayout::addItem
          (QGraphicsGridLayout *this,QGraphicsLayoutItem *item,int row,int column,int rowSpan,
          int columnSpan,Alignment alignment)

{
  QGraphicsLayoutPrivate *this_00;
  QGraphicsGridLayoutEngineItem *this_01;
  ulong uVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((column | row) < 0) {
    uVar1 = (ulong)(uint)column;
    if (row < 0) {
      uVar1 = (ulong)(uint)row;
    }
    pcVar2 = "QGraphicsGridLayout::addItem: invalid row/column: %d";
LAB_0056ea39:
    local_40 = "default";
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    QMessageLogger::warning(local_58,pcVar2,uVar1);
  }
  else {
    if ((rowSpan < 1) || (columnSpan < 1)) {
      uVar1 = (ulong)(uint)columnSpan;
      if (rowSpan < 1) {
        uVar1 = (ulong)(uint)rowSpan;
      }
      pcVar2 = "QGraphicsGridLayout::addItem: invalid row span/column span: %d";
      goto LAB_0056ea39;
    }
    if (item == (QGraphicsLayoutItem *)0x0) {
      pcVar2 = "QGraphicsGridLayout::addItem: cannot add null item";
    }
    else {
      if (item != (QGraphicsLayoutItem *)this) {
        this_00 = (QGraphicsLayoutPrivate *)
                  (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
        QGraphicsLayoutPrivate::addChildLayoutItem(this_00,item);
        this_01 = (QGraphicsGridLayoutEngineItem *)operator_new(0x30);
        QGraphicsGridLayoutEngineItem::QGraphicsGridLayoutEngineItem
                  (this_01,item,row,column,rowSpan,columnSpan,alignment);
        QGridLayoutEngine::insertItem
                  ((QGridLayoutItem *)&this_00[1].super_QGraphicsLayoutItemPrivate.sizePolicy,
                   (int)this_01);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])
                    (this);
          return;
        }
        goto LAB_0056eaba;
      }
      pcVar2 = "QGraphicsGridLayout::addItem: cannot insert itself";
    }
    local_40 = "default";
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    QMessageLogger::warning(local_58,pcVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0056eaba:
  __stack_chk_fail();
}

Assistant:

void QGraphicsGridLayout::addItem(QGraphicsLayoutItem *item, int row, int column,
                                  int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGraphicsGridLayout);
    if (row < 0 || column < 0) {
        qWarning("QGraphicsGridLayout::addItem: invalid row/column: %d",
                 row < 0 ? row : column);
        return;
    }
    if (columnSpan < 1 || rowSpan < 1) {
        qWarning("QGraphicsGridLayout::addItem: invalid row span/column span: %d",
                 rowSpan < 1 ? rowSpan : columnSpan);
        return;
    }
    if (!item) {
        qWarning("QGraphicsGridLayout::addItem: cannot add null item");
        return;
    }
    if (item == this) {
        qWarning("QGraphicsGridLayout::addItem: cannot insert itself");
        return;
    }

    d->addChildLayoutItem(item);

    QGraphicsGridLayoutEngineItem *gridEngineItem = new QGraphicsGridLayoutEngineItem(item, row, column, rowSpan, columnSpan, alignment);
    d->engine.insertItem(gridEngineItem, -1);
    invalidate();
}